

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

int google::OpenObjectFileContainingPcAndGetStartAddress
              (uint64_t pc,uint64_t *start_address,uint64_t *base_address,char *out_file_name,
              int out_file_name_size)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  int local_544;
  int num_spaces;
  uint64_t file_offset;
  Elf64_Phdr phdr;
  int local_4f8;
  uint i;
  Elf64_Ehdr ehdr;
  char *flags_start;
  uint64_t end_address;
  char *eol;
  char *cursor;
  LineReader reader;
  char local_458 [4];
  int num_maps;
  char buf [1024];
  FileDescriptor wrapped_mem_fd;
  int mem_fd;
  FileDescriptor local_40;
  int local_3c;
  FileDescriptor wrapped_maps_fd;
  int maps_fd;
  int object_fd;
  int out_file_name_size_local;
  char *out_file_name_local;
  uint64_t *base_address_local;
  uint64_t *start_address_local;
  uint64_t pc_local;
  
  do {
    local_3c = open("/proc/self/maps",0);
    bVar4 = false;
    if (local_3c < 0) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  anon_unknown_3::FileDescriptor::FileDescriptor(&local_40,local_3c);
  iVar1 = anon_unknown_3::FileDescriptor::get(&local_40);
  if (iVar1 < 0) {
    pc_local._4_4_ = -1;
  }
  else {
    do {
      buf._1020_4_ = open("/proc/self/mem",0);
      bVar4 = false;
      if ((int)buf._1020_4_ < 0) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    anon_unknown_3::FileDescriptor::FileDescriptor((FileDescriptor *)(buf + 0x3f8),buf._1020_4_);
    iVar1 = anon_unknown_3::FileDescriptor::get((FileDescriptor *)(buf + 0x3f8));
    if (iVar1 < 0) {
      pc_local._4_4_ = -1;
    }
    else {
      reader.eod_._4_4_ = 0;
      iVar1 = anon_unknown_3::FileDescriptor::get(&local_40);
      anon_unknown_3::LineReader::LineReader((LineReader *)&cursor,iVar1,local_458,0x400,0);
      do {
        reader.eod_._4_4_ = reader.eod_._4_4_ + 1;
        bVar4 = anon_unknown_3::LineReader::ReadLine
                          ((LineReader *)&cursor,&eol,(char **)&end_address);
        if (!bVar4) {
          pc_local._4_4_ = -1;
          goto LAB_00130324;
        }
        eol = GetHex(eol,(char *)end_address,start_address);
        if ((eol == (char *)end_address) || (*eol != '-')) {
          pc_local._4_4_ = -1;
          goto LAB_00130324;
        }
        eol = eol + 1;
        pcVar3 = GetHex(eol,(char *)end_address,(uint64_t *)&flags_start);
        if ((pcVar3 == (char *)end_address) || (*pcVar3 != ' ')) {
          pc_local._4_4_ = -1;
          eol = pcVar3;
          goto LAB_00130324;
        }
        ehdr._56_8_ = pcVar3 + 1;
        eol = (char *)ehdr._56_8_;
        while( true ) {
          bVar4 = false;
          if (eol < end_address) {
            bVar4 = *eol != ' ';
          }
          if (!bVar4) break;
          eol = eol + 1;
        }
        if ((eol == (char *)end_address) || (eol < pcVar3 + 5)) {
          pc_local._4_4_ = -1;
          goto LAB_00130324;
        }
        if (((*(char *)ehdr._56_8_ == 'r') &&
            (bVar4 = ReadFromOffsetExact(buf._1020_4_,&local_4f8,0x40,*start_address), bVar4)) &&
           (local_4f8 == 0x464c457f)) {
          if (ehdr.e_ident._8_2_ == 2) {
            *base_address = 0;
          }
          else if (ehdr.e_ident._8_2_ == 3) {
            *base_address = *start_address;
            for (phdr.p_align._4_4_ = 0; phdr.p_align._4_4_ != (ushort)ehdr.e_flags;
                phdr.p_align._4_4_ = phdr.p_align._4_4_ + 1) {
              bVar4 = ReadFromOffsetExact(buf._1020_4_,&file_offset,0x38,
                                          *start_address + ehdr.e_entry +
                                          (ulong)phdr.p_align._4_4_ * 0x38);
              if (((bVar4) && ((int)file_offset == 1)) && (phdr._0_8_ == 0)) {
                *base_address = *start_address - phdr.p_offset;
                break;
              }
            }
          }
        }
      } while (((pc < *start_address) || (flags_start <= pc)) ||
              ((*(char *)ehdr._56_8_ != 'r' || (*(char *)(ehdr._56_8_ + 2) != 'x'))));
      eol = eol + 1;
      eol = GetHex(eol,(char *)end_address,(uint64_t *)&stack0xfffffffffffffac0);
      if ((eol == (char *)end_address) || (*eol != ' ')) {
        pc_local._4_4_ = -1;
      }
      else {
        local_544 = 0;
        do {
          while( true ) {
            eol = eol + 1;
            if (end_address <= eol) goto LAB_0013026b;
            if (*eol != ' ') break;
            local_544 = local_544 + 1;
          }
        } while (local_544 < 2);
LAB_0013026b:
        if (eol == (char *)end_address) {
          pc_local._4_4_ = -1;
        }
        else {
          do {
            wrapped_maps_fd.fd_ = open(eol,0);
            bVar4 = false;
            if (wrapped_maps_fd.fd_ < 0) {
              piVar2 = __errno_location();
              bVar4 = *piVar2 == 4;
            }
          } while (bVar4);
          if (wrapped_maps_fd.fd_ < 0) {
            strncpy(out_file_name,eol,(long)out_file_name_size);
            out_file_name[out_file_name_size + -1] = '\0';
            pc_local._4_4_ = -1;
          }
          else {
            pc_local._4_4_ = wrapped_maps_fd.fd_;
          }
        }
      }
    }
LAB_00130324:
    anon_unknown_3::FileDescriptor::~FileDescriptor((FileDescriptor *)(buf + 0x3f8));
  }
  anon_unknown_3::FileDescriptor::~FileDescriptor(&local_40);
  return pc_local._4_4_;
}

Assistant:

static ATTRIBUTE_NOINLINE int
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t &start_address,
                                             uint64_t &base_address,
                                             char *out_file_name,
                                             int out_file_name_size) {
  int object_fd;

  int maps_fd;
  NO_INTR(maps_fd = open("/proc/self/maps", O_RDONLY));
  FileDescriptor wrapped_maps_fd(maps_fd);
  if (wrapped_maps_fd.get() < 0) {
    return -1;
  }

  int mem_fd;
  NO_INTR(mem_fd = open("/proc/self/mem", O_RDONLY));
  FileDescriptor wrapped_mem_fd(mem_fd);
  if (wrapped_mem_fd.get() < 0) {
    return -1;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  int num_maps = 0;
  LineReader reader(wrapped_maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    num_maps++;
    const char *cursor;
    const char *eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return -1;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char * const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return -1;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd, &ehdr, sizeof(ElfW(Ehdr)), start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd, &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (!(start_address <= pc && pc < end_address)) {
      continue;  // We skip this map.  PC isn't in this map.
    }

   // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return -1;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    NO_INTR(object_fd = open(cursor, O_RDONLY));
    if (object_fd < 0) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return -1;
    }
    return object_fd;
  }
}